

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outchar_html_stream(out_stream_info *stream,uint htmlchar)

{
  char c;
  ulong uVar1;
  amp_tbl_t *paVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char xlat_buf [50];
  char local_48;
  char local_47 [55];
  
  pcVar5 = &local_48;
  if (amp_tbl[0].html_cval == htmlchar) {
    paVar2 = amp_tbl;
    bVar6 = true;
  }
  else {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      bVar6 = uVar3 < 0x1c98;
      if (!bVar6) goto LAB_0021de27;
      uVar1 = uVar3 + 0x18;
    } while (*(uint *)((long)&amp_tbl[1].html_cval + uVar3) != htmlchar);
    paVar2 = (amp_tbl_t *)(uVar3 + 0x373cc8);
  }
  if ((bVar6) && (pcVar4 = paVar2->expan, pcVar4 != (char *)0x0)) {
    c = *pcVar4;
    while (c != '\0') {
      pcVar4 = pcVar4 + 1;
      outchar_noxlat_stream(stream,c);
      c = *pcVar4;
    }
  }
  else {
LAB_0021de27:
    os_xlat_html4(htmlchar,&local_48,0x32);
    while (local_48 != '\0') {
      pcVar5 = pcVar5 + 1;
      outchar_noxlat_stream(stream,local_48);
      local_48 = *pcVar5;
    }
  }
  return;
}

Assistant:

static void outchar_html_stream(out_stream_info *stream,
                                unsigned int htmlchar)
{
    struct amp_tbl_t *ampptr;

    /* 
     *   search for a mapping entry for this entity, in case it's defined
     *   in an external mapping file 
     */
    for (ampptr = amp_tbl ;
         ampptr < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++ampptr)
    {
        /* if this is the one, stop looking */
        if (ampptr->html_cval == htmlchar)
            break;
    }

    /* 
     *   If we found a mapping table entry, and the entry has an expansion
     *   from the external character mapping table file, use the external
     *   expansion; otherwise, use the default expansion.  
     */
    if (ampptr >= amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0])
        || ampptr->expan == 0)
    {
        char xlat_buf[50];

        /* 
         *   there's no external mapping table file expansion -- use the
         *   default OS mapping routine 
         */
        os_xlat_html4(htmlchar, xlat_buf, sizeof(xlat_buf));
        outstring_noxlat_stream(stream, xlat_buf);
    }
    else
    {
        /* 
         *   use the explicit mapping from the mapping table file 
         */
        outstring_noxlat_stream(stream, ampptr->expan);
    }
}